

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::operator/=(path *this,path *p)

{
  char *pcVar1;
  size_t __n;
  ulong uVar2;
  bool bVar3;
  undefined8 uVar4;
  const_iterator cVar5;
  int iVar6;
  ulong uVar7;
  size_type sVar8;
  char cVar9;
  char cVar10;
  bool bVar11;
  bool bVar12;
  iterator i;
  iterator iter;
  const_iterator local_150;
  undefined1 local_148 [40];
  _Alloc_hider local_120;
  char local_110 [24];
  undefined1 local_f8 [32];
  const_iterator local_d8;
  _Alloc_hider local_d0;
  size_type local_c8;
  char local_c0 [16];
  path local_b0;
  path local_90;
  path local_70;
  path local_50;
  
  uVar7 = (p->_path)._M_string_length;
  cVar9 = (char)this;
  if (uVar7 == 0) {
    sVar8 = (this->_path)._M_string_length;
    if (sVar8 == 0) {
      return this;
    }
    cVar10 = (this->_path)._M_dataplus._M_p[sVar8 - 1];
    if (cVar10 == '/') {
      return this;
    }
    if (cVar10 == ':') {
      return this;
    }
    std::__cxx11::string::push_back(cVar9);
    return this;
  }
  cVar10 = (char)p;
  if ((((uVar7 < 3) || (pcVar1 = (p->_path)._M_dataplus._M_p, *pcVar1 != '/')) || (pcVar1[1] != '/')
      ) || ((pcVar1[2] == 0x2f || (iVar6 = isprint((int)pcVar1[2]), iVar6 == 0)))) {
    uVar7 = 0;
  }
  else {
    uVar7 = std::__cxx11::string::find(cVar10,0x2f);
    if (uVar7 == 0xffffffffffffffff) {
      uVar7 = (p->_path)._M_string_length;
    }
  }
  if (uVar7 < (p->_path)._M_string_length) {
    bVar11 = (p->_path)._M_dataplus._M_p[uVar7] == '/';
  }
  else {
    bVar11 = false;
  }
  if (bVar11) {
    root_name(&local_90,this);
    __n = (this->_path)._M_string_length;
    if (((__n == local_90._path._M_string_length) &&
        ((__n == 0 ||
         (iVar6 = bcmp((this->_path)._M_dataplus._M_p,local_90._path._M_dataplus._M_p,__n),
         iVar6 == 0)))) && (iVar6 = std::__cxx11::string::compare((char *)p), iVar6 == 0))
    goto LAB_0011e2dc;
    bVar3 = false;
    bVar12 = true;
    bVar11 = true;
  }
  else {
LAB_0011e2dc:
    if ((((2 < (p->_path)._M_string_length) &&
         (pcVar1 = (p->_path)._M_dataplus._M_p, *pcVar1 == '/')) && (pcVar1[1] == '/')) &&
       ((pcVar1[2] != 0x2f && (iVar6 = isprint((int)pcVar1[2]), iVar6 != 0)))) {
      sVar8 = std::__cxx11::string::find(cVar10,0x2f);
      if (sVar8 == 0xffffffffffffffff) {
        sVar8 = (p->_path)._M_string_length;
      }
      if (sVar8 != 0) {
        root_name(&local_b0,p);
        root_name(&local_70,this);
        iVar6 = compare(&local_b0,&local_70);
        bVar12 = iVar6 != 0;
        bVar3 = true;
        goto LAB_0011e370;
      }
    }
    bVar3 = false;
    bVar12 = false;
  }
LAB_0011e370:
  if (bVar3) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._path._M_dataplus._M_p != &local_70._path.field_2) {
      operator_delete(local_70._path._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._path._M_dataplus._M_p != &local_b0._path.field_2) {
      operator_delete(local_b0._path._M_dataplus._M_p);
    }
  }
  if ((bVar11) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._path._M_dataplus._M_p != &local_90._path.field_2)) {
    operator_delete(local_90._path._M_dataplus._M_p);
  }
  if (bVar12) {
    std::__cxx11::string::_M_assign((string *)this);
    return this;
  }
  if (((((p->_path)._M_string_length < 3) || (pcVar1 = (p->_path)._M_dataplus._M_p, *pcVar1 != '/'))
      || (pcVar1[1] != '/')) ||
     ((pcVar1[2] == 0x2f || (iVar6 = isprint((int)pcVar1[2]), iVar6 == 0)))) {
    uVar7 = 0;
  }
  else {
    uVar7 = std::__cxx11::string::find(cVar10,0x2f);
    if (uVar7 == 0xffffffffffffffff) {
      uVar7 = (p->_path)._M_string_length;
    }
  }
  if ((uVar7 < (p->_path)._M_string_length) && ((p->_path)._M_dataplus._M_p[uVar7] == '/')) {
    root_name((path *)local_f8,this);
    std::__cxx11::string::_M_assign((string *)this);
    if ((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_) != local_f8 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_f8._4_4_,local_f8._0_4_));
    }
    goto LAB_0011e56c;
  }
  if (((this->_path)._M_string_length < 3) ||
     ((((pcVar1 = (this->_path)._M_dataplus._M_p, *pcVar1 != '/' || (pcVar1[1] != '/')) ||
       (pcVar1[2] == 0x2f)) || (iVar6 = isprint((int)pcVar1[2]), iVar6 == 0)))) {
    uVar7 = 0;
  }
  else {
    uVar7 = std::__cxx11::string::find(cVar9,0x2f);
    if (uVar7 == 0xffffffffffffffff) {
      uVar7 = (this->_path)._M_string_length;
    }
  }
  uVar2 = (this->_path)._M_string_length;
  if ((uVar7 < uVar2) && ((this->_path)._M_dataplus._M_p[uVar7] == '/')) {
LAB_0011e513:
    bVar11 = has_relative_path(this);
    if (bVar11) {
      filename(&local_50,this);
      bVar11 = local_50._path._M_string_length != 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._path._M_dataplus._M_p != &local_50._path.field_2) {
        operator_delete(local_50._path._M_dataplus._M_p);
      }
    }
    else {
      bVar11 = false;
    }
    if (!bVar11) goto LAB_0011e56c;
  }
  else {
    if (((uVar2 < 3) ||
        ((pcVar1 = (this->_path)._M_dataplus._M_p, *pcVar1 != '/' || (pcVar1[1] != '/')))) ||
       ((pcVar1[2] == 0x2f || (iVar6 = isprint((int)pcVar1[2]), iVar6 == 0)))) {
      uVar7 = 0;
    }
    else {
      uVar7 = std::__cxx11::string::find(cVar9,0x2f);
      if (uVar7 == 0xffffffffffffffff) {
        uVar7 = (this->_path)._M_string_length;
      }
    }
    if (((this->_path)._M_string_length <= uVar7) || ((this->_path)._M_dataplus._M_p[uVar7] != '/'))
    goto LAB_0011e513;
  }
  std::__cxx11::string::push_back(cVar9);
LAB_0011e56c:
  local_148._0_8_ = (p->_path)._M_dataplus._M_p;
  iterator::iterator((iterator *)local_f8,p,(const_iterator *)local_148);
  if ((((2 < (p->_path)._M_string_length) && (pcVar1 = (p->_path)._M_dataplus._M_p, *pcVar1 == '/'))
      && (pcVar1[1] == '/')) &&
     ((pcVar1[2] != 0x2f && (iVar6 = isprint((int)pcVar1[2]), iVar6 != 0)))) {
    sVar8 = std::__cxx11::string::find(cVar10,0x2f);
    if (sVar8 == 0xffffffffffffffff) {
      sVar8 = (p->_path)._M_string_length;
    }
    if (sVar8 != 0) {
      iterator::operator++((iterator *)local_f8);
    }
  }
  bVar11 = true;
  while( true ) {
    local_150._M_current = (p->_path)._M_dataplus._M_p + (p->_path)._M_string_length;
    iterator::iterator((iterator *)local_148,p,&local_150);
    cVar5._M_current = local_d8._M_current;
    uVar4 = local_148._32_8_;
    if (local_120._M_p != local_110) {
      operator_delete(local_120._M_p);
    }
    if (cVar5._M_current == (char *)uVar4) break;
    if ((!bVar11) &&
       ((sVar8 = (this->_path)._M_string_length, sVar8 == 0 ||
        ((this->_path)._M_dataplus._M_p[sVar8 - 1] != '/')))) {
      std::__cxx11::string::push_back(cVar9);
    }
    local_148._32_8_ = local_d8._M_current;
    local_148._16_4_ = local_f8._16_4_;
    local_148._20_4_ = local_f8._20_4_;
    local_148._24_4_ = local_f8._24_4_;
    local_148._28_4_ = local_f8._28_4_;
    local_148._4_4_ = local_f8._4_4_;
    local_148._0_4_ = local_f8._0_4_;
    local_148._8_4_ = local_f8._8_4_;
    local_148._12_4_ = local_f8._12_4_;
    local_120._M_p = local_110;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,local_d0._M_p,local_d0._M_p + local_c8);
    iterator::operator++((iterator *)local_f8);
    std::__cxx11::string::_M_append((char *)this,(ulong)local_120._M_p);
    if (local_120._M_p != local_110) {
      operator_delete(local_120._M_p);
    }
    bVar11 = false;
  }
  if (local_d0._M_p != local_c0) {
    operator_delete(local_d0._M_p);
  }
  return this;
}

Assistant:

GHC_INLINE path& path::operator/=(const path& p)
{
    if (p.empty()) {
        // was: if ((!has_root_directory() && is_absolute()) || has_filename())
        if (!_path.empty() && _path[_path.length() - 1] != preferred_separator && _path[_path.length() - 1] != ':') {
            _path += preferred_separator;
        }
        return *this;
    }
    if ((p.is_absolute() && (_path != root_name()._path || p._path != "/")) || (p.has_root_name() && p.root_name() != root_name())) {
        assign(p);
        return *this;
    }
    if (p.has_root_directory()) {
        assign(root_name());
    }
    else if ((!has_root_directory() && is_absolute()) || has_filename()) {
        _path += preferred_separator;
    }
    auto iter = p.begin();
    bool first = true;
    if (p.has_root_name()) {
        ++iter;
    }
    while (iter != p.end()) {
        if (!first && !(!_path.empty() && _path[_path.length() - 1] == preferred_separator)) {
            _path += preferred_separator;
        }
        first = false;
        _path += (*iter++).native();
    }
    check_long_path();
    return *this;
}